

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void on_request(http_s *request)

{
  ulong uVar1;
  int iVar2;
  fiobj_object_vtable_s *pfVar3;
  uint uVar4;
  uintptr_t length;
  char cVar5;
  char *data;
  fio_str_info_s ret;
  fio_str_info_s local_28;
  
  uVar1 = request->method;
  if (uVar1 == 0) {
LAB_001050fc:
    local_28.data = anon_var_dwarf_1dd;
    local_28.len._0_4_ = 4;
    goto LAB_0010510f;
  }
  cVar5 = (char)uVar1;
  if ((uVar1 & 1) != 0) {
    fio_ltocstr(&local_28,(long)uVar1 >> 1);
    goto LAB_00105113;
  }
  switch((uint)uVar1 & 6) {
  case 0:
    cVar5 = *(char *)(uVar1 & 0xfffffffffffffff8);
LAB_00105091:
    switch(cVar5) {
    case '\'':
      pfVar3 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      goto switchD_00105086_caseD_2;
    case ')':
      pfVar3 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      goto switchD_00105086_caseD_4;
    case '+':
      pfVar3 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar3 = &FIOBJECT_VTABLE_NUMBER;
    }
    break;
  case 2:
switchD_00105086_caseD_2:
    pfVar3 = &FIOBJECT_VTABLE_STRING;
    break;
  case 4:
switchD_00105086_caseD_4:
    pfVar3 = &FIOBJECT_VTABLE_HASH;
    break;
  case 6:
    if (cVar5 == '&') {
      local_28.data = anon_var_dwarf_1e8;
      local_28.len._0_4_ = 5;
    }
    else {
      uVar4 = (uint)uVar1 & 0xff;
      if (uVar4 != 0x16) {
        if (uVar4 == 6) goto LAB_001050fc;
        goto LAB_00105091;
      }
      local_28.data = anon_var_dwarf_1f3;
      local_28.len._0_4_ = 4;
    }
LAB_0010510f:
    local_28.capa._0_4_ = 0;
    local_28.capa._4_4_ = 0;
    local_28.len._4_4_ = 0;
    goto LAB_00105113;
  }
  (*pfVar3->to_str)(&local_28,uVar1);
LAB_00105113:
  iVar2 = strcmp("POST",local_28.data);
  if (iVar2 == 0) {
    iVar2 = request_contains_shutdown_token(request);
    if (iVar2 != 0) {
      http_send_body(request,"{\"status\": 0}\r\n",0xf);
      log_log(2,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/src/main.c"
              ,0x47,"Shutting down!");
      system("sudo shutdown -h now");
      return;
    }
    data = "{\"status\": -1}\r\n";
    length = 0x10;
  }
  else {
    data = "{\"status\": 1}\r\n";
    length = 0xf;
  }
  http_send_body(request,data,length);
  return;
}

Assistant:

void on_request(http_s *request) {
  /* honour non-POST requests with HTTP 200 */
  if (strcmp("POST", fiobj_obj2cstr(request->method).data)) {
    http_send_body(request, "{\"status\": 1}\r\n", 15);
    return;
  }

  /* shutdown only if body is JSON object {"token": "<RSHUTDOWN_TOKEN_ENV_VAR>"} */
  if (request_contains_shutdown_token(request)) {
      http_send_body(request, "{\"status\": 0}\r\n", 15);
#ifdef NO_SHUTDOWN
      log_info("NO_SHUTDOWN set - not shutting down");
#else
      log_info("Shutting down!");
      system("sudo shutdown -h now");
#endif
  }
  else {
      http_send_body(request, "{\"status\": -1}\r\n", 16);
  }
}